

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Print.H
# Opt level: O2

ostream * amrex::operator<<(ostream *os,Array<unsigned_int,_3> *a)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,'(');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,')');
  return os;
}

Assistant:

std::ostream& operator<< (std::ostream& os, Array<T,AMREX_SPACEDIM> const& a)
    {
        os << AMREX_D_TERM( '(' << a[0] , <<
                            ',' << a[1] , <<
                            ',' << a[2])  << ')';
        return os;
    }